

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_LadderDatabase.cpp
# Opt level: O0

void __thiscall RenX::LadderDatabase::~LadderDatabase(LadderDatabase *this)

{
  Entry *this_00;
  bool bVar1;
  reference ppLVar2;
  reference ppLVar3;
  const_iterator local_28;
  __normal_iterator<RenX::LadderDatabase_**,_std::vector<RenX::LadderDatabase_*,_std::allocator<RenX::LadderDatabase_*>_>_>
  local_20;
  __normal_iterator<RenX::LadderDatabase_**,_std::vector<RenX::LadderDatabase_*,_std::allocator<RenX::LadderDatabase_*>_>_>
  local_18;
  iterator itr;
  LadderDatabase *this_local;
  
  *(undefined ***)this = &PTR_process_data_001fa2b0;
  itr._M_current = (LadderDatabase **)this;
  while (this->m_head != (Entry *)0x0) {
    this->m_end = this->m_head;
    this->m_head = this->m_head->next;
    this_00 = this->m_end;
    if (this_00 != (Entry *)0x0) {
      Entry::~Entry(this_00);
      operator_delete(this_00,0x140);
    }
  }
  local_18._M_current =
       (LadderDatabase **)
       std::vector<RenX::LadderDatabase_*,_std::allocator<RenX::LadderDatabase_*>_>::begin
                 (&g_ladder_databases);
  do {
    local_20._M_current =
         (LadderDatabase **)
         std::vector<RenX::LadderDatabase_*,_std::allocator<RenX::LadderDatabase_*>_>::end
                   (&g_ladder_databases);
    bVar1 = __gnu_cxx::
            operator==<RenX::LadderDatabase_**,_std::vector<RenX::LadderDatabase_*,_std::allocator<RenX::LadderDatabase_*>_>_>
                      (&local_18,&local_20);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
LAB_001881a0:
      if (default_ladder_database == this) {
        bVar1 = std::vector<RenX::LadderDatabase_*,_std::allocator<RenX::LadderDatabase_*>_>::empty
                          (&g_ladder_databases);
        if (bVar1) {
          default_ladder_database = (value_type)0x0;
        }
        else {
          ppLVar3 = std::vector<RenX::LadderDatabase_*,_std::allocator<RenX::LadderDatabase_*>_>::
                    operator[](&g_ladder_databases,0);
          default_ladder_database = *ppLVar3;
        }
      }
      std::__cxx11::string::~string((string *)&this->m_name);
      Jupiter::Database::~Database(&this->super_Database);
      return;
    }
    ppLVar2 = __gnu_cxx::
              __normal_iterator<RenX::LadderDatabase_**,_std::vector<RenX::LadderDatabase_*,_std::allocator<RenX::LadderDatabase_*>_>_>
              ::operator*(&local_18);
    if (*ppLVar2 == this) {
      __gnu_cxx::
      __normal_iterator<RenX::LadderDatabase*const*,std::vector<RenX::LadderDatabase*,std::allocator<RenX::LadderDatabase*>>>
      ::__normal_iterator<RenX::LadderDatabase**>
                ((__normal_iterator<RenX::LadderDatabase*const*,std::vector<RenX::LadderDatabase*,std::allocator<RenX::LadderDatabase*>>>
                  *)&local_28,&local_18);
      std::vector<RenX::LadderDatabase_*,_std::allocator<RenX::LadderDatabase_*>_>::erase
                (&g_ladder_databases,local_28);
      goto LAB_001881a0;
    }
    __gnu_cxx::
    __normal_iterator<RenX::LadderDatabase_**,_std::vector<RenX::LadderDatabase_*,_std::allocator<RenX::LadderDatabase_*>_>_>
    ::operator++(&local_18);
  } while( true );
}

Assistant:

RenX::LadderDatabase::~LadderDatabase() {
	while (m_head != nullptr) {
		m_end = m_head;
		m_head = m_head->next;
		delete m_end;
	}

	for (auto itr = g_ladder_databases.begin(); itr != g_ladder_databases.end(); ++itr) {
		if (*itr == this) {
			g_ladder_databases.erase(itr);
			break;
		}
	}

	if (RenX::default_ladder_database == this) {
		if (g_ladder_databases.empty()) {
			RenX::default_ladder_database = nullptr;
		}
		else {
			RenX::default_ladder_database = g_ladder_databases[0];
		}
	}
}